

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O0

int output_bit_array(bit_array_t *bit_array,byte_t *output_buffer,FILE *output_file_ptr)

{
  uint bit_pos_00;
  int iVar1;
  long lVar2;
  int rc;
  int bit_pos;
  long buffer_byte_idx;
  int i;
  FILE *output_file_ptr_local;
  byte_t *output_buffer_local;
  bit_array_t *bit_array_local;
  
  buffer_byte_idx._4_4_ = (uint)bit_array->length;
  while( true ) {
    while( true ) {
      buffer_byte_idx._4_4_ = buffer_byte_idx._4_4_ - 1;
      if ((int)buffer_byte_idx._4_4_ < 0) {
        return 0;
      }
      lVar2 = bit_idx_to_byte_idx((long)out_bit_idx);
      bit_pos_00 = bit_pos_in_current_byte((long)out_bit_idx);
      if (bit_array->buffer[(int)buffer_byte_idx._4_4_] == '1') {
        bit_set_one(output_buffer + lVar2,bit_pos_00);
      }
      else {
        bit_set_zero(output_buffer + lVar2,bit_pos_00);
      }
      if (out_bit_idx == 0x1fff) break;
      out_bit_idx = out_bit_idx + 1;
    }
    iVar1 = flush_data(output_buffer,output_file_ptr);
    if (iVar1 != 0) break;
    out_bit_idx = 0;
    memset(output_buffer,0,0x400);
  }
  return iVar1;
}

Assistant:

int output_bit_array(const bit_array_t* bit_array, byte_t *output_buffer, FILE* output_file_ptr) {
    for(int i = bit_array->length-1; i>=0; i--) {
        // calculate the current position (in byte) of the output_buffer
        long buffer_byte_idx = bit_idx_to_byte_idx(out_bit_idx);

        // calculate which bit to change in the byte 11100000
        int bit_pos = bit_pos_in_current_byte(out_bit_idx);

        if(bit_array->buffer[i] == BIT_1)
            bit_set_one(&output_buffer[buffer_byte_idx], bit_pos);
        else
            bit_set_zero(&output_buffer[buffer_byte_idx], bit_pos);

        // buffer full, flush data to file
        if(out_bit_idx+1 == BUFFER_SIZE * SYMBOL_BITS) {
            int rc = flush_data(output_buffer, output_file_ptr);
            if(rc != RC_OK)
                return rc;

            // reset buffer index
            out_bit_idx = 0;
            memset(output_buffer, 0, BUFFER_SIZE);
        } else {
            out_bit_idx++;
        }
    }

    return RC_OK;
}